

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

Vec3fa __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::computeDirection(CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
                   *this,uint primID)

{
  float fVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  RefCount RVar9;
  ulong in_RDX;
  undefined4 in_register_00000034;
  Vec3fa *axis1;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vec3fa VVar15;
  
  plVar3 = *(long **)(CONCAT44(in_register_00000034,primID) + 0x188);
  uVar2 = *(uint *)(*(long *)(CONCAT44(in_register_00000034,primID) + 0x58) +
                   (in_RDX & 0xffffffff) * *(long *)(CONCAT44(in_register_00000034,primID) + 0x68));
  lVar4 = *plVar3;
  lVar5 = plVar3[2];
  lVar10 = (ulong)(uVar2 + 1) * lVar5;
  lVar11 = (ulong)(uVar2 + 2) * lVar5;
  lVar12 = (ulong)(uVar2 + 3) * lVar5;
  fVar1 = *(float *)(CONCAT44(in_register_00000034,primID) + 0x24c);
  auVar14 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + (ulong)uVar2 * lVar5),
                          ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + (ulong)uVar2 * lVar5))),
                          0x30);
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar10),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar10))),0x30);
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar11),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar11))),0x30);
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar12),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar12))),0x30);
  auVar13._0_4_ = auVar14._0_4_ * 0.16666667 + auVar6._0_4_ * 0.6666667 + auVar7._0_4_ * 0.16666667;
  auVar13._4_4_ = auVar14._4_4_ * 0.16666667 + auVar6._4_4_ * 0.6666667 + auVar7._4_4_ * 0.16666667;
  auVar13._8_4_ = auVar14._8_4_ * 0.16666667 + auVar6._8_4_ * 0.6666667 + auVar7._8_4_ * 0.16666667;
  auVar13._12_4_ =
       auVar14._12_4_ * 0.16666667 + auVar6._12_4_ * 0.6666667 + auVar7._12_4_ * 0.16666667;
  auVar14._0_8_ =
       CONCAT44(auVar6._4_4_ * 0.16666667 + auVar7._4_4_ * 0.6666667 + auVar8._4_4_ * 0.16666667,
                auVar6._0_4_ * 0.16666667 + auVar7._0_4_ * 0.6666667 + auVar8._0_4_ * 0.16666667);
  auVar14._8_4_ = auVar6._8_4_ * 0.16666667 + auVar7._8_4_ * 0.6666667 + auVar8._8_4_ * 0.16666667;
  auVar14._12_4_ =
       auVar6._12_4_ * 0.16666667 + auVar7._12_4_ * 0.6666667 + auVar8._12_4_ * 0.16666667;
  RVar9 = (RefCount)vsubps_avx(auVar14,auVar13);
  (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.super_Geometry.
  super_RefCount = RVar9;
  VVar15.field_0._0_8_ = RVar9._vptr_RefCount;
  VVar15.field_0._8_8_ = auVar14._0_8_;
  return (Vec3fa)VVar15.field_0;
}

Assistant:

Vec3fa computeDirection(unsigned int primID) const
      {
        const Curve3ff c = getCurveScaledRadius(primID);
        const Vec3fa p0 = c.begin();
        const Vec3fa p3 = c.end();
        const Vec3fa axis1 = p3 - p0;
        return axis1;
      }